

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunkset_tpl.h
# Opt level: O0

uint8_t * chunkunroll_avx512(uint8_t *out,uint *dist,uint *len)

{
  uint *in_RDX;
  uint *in_RSI;
  uint8_t *in_RDI;
  bool bVar1;
  chunk_t_conflict chunk;
  uchar *from;
  chunk_t_conflict *in_stack_ffffffffffffff68;
  uint8_t *in_stack_ffffffffffffff70;
  longlong local_80 [6];
  uint8_t *local_50;
  uint *local_48;
  uint *local_40;
  uint8_t *local_38;
  
  local_50 = in_RDI + -(ulong)*in_RSI;
  local_48 = in_RDX;
  local_40 = in_RSI;
  local_38 = in_RDI;
  while( true ) {
    bVar1 = false;
    if (*local_40 < *local_48) {
      bVar1 = *local_40 < 0x20;
    }
    if (!bVar1) break;
    loadchunk(local_50,(chunk_t_conflict *)local_80);
    storechunk(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    local_38 = local_38 + *local_40;
    *local_48 = *local_48 - *local_40;
    *local_40 = *local_40 + *local_40;
  }
  return local_38;
}

Assistant:

static inline uint8_t* CHUNKUNROLL(uint8_t *out, unsigned *dist, unsigned *len) {
    unsigned char const *from = out - *dist;
    chunk_t chunk;
    while (*dist < *len && *dist < sizeof(chunk_t)) {
        loadchunk(from, &chunk);
        storechunk(out, &chunk);
        out += *dist;
        *len -= *dist;
        *dist += *dist;
    }
    return out;
}